

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classic_Emu.cpp
# Opt level: O0

blargg_err_t __thiscall Classic_Emu::set_sample_rate_(Classic_Emu *this,long rate)

{
  void *pvVar1;
  blargg_err_t pcVar2;
  undefined8 in_RSI;
  Stereo_Buffer *in_RDI;
  void *local_48;
  Stereo_Buffer *this_00;
  char *local_8;
  
  if (*(long *)&in_RDI[1].field_0xa0 == 0) {
    if (*(long *)&in_RDI[1].field_0xa8 == 0) {
      this_00 = in_RDI;
      pvVar1 = Multi_Buffer::operator_new(0x80e785);
      local_48 = (void *)0x0;
      if (pvVar1 != (void *)0x0) {
        Stereo_Buffer::Stereo_Buffer(this_00);
        local_48 = pvVar1;
      }
      *(void **)&in_RDI[1].field_0xa8 = local_48;
      if (local_48 == (void *)0x0) {
        local_8 = "Out of memory";
        return local_8;
      }
    }
    *(undefined8 *)&in_RDI[1].field_0xa0 = *(undefined8 *)&in_RDI[1].field_0xa8;
  }
  pcVar2 = (blargg_err_t)
           (**(code **)(**(long **)&in_RDI[1].field_0xa0 + 0x20))
                     (*(long **)&in_RDI[1].field_0xa0,in_RSI,0x32);
  return pcVar2;
}

Assistant:

blargg_err_t Classic_Emu::set_sample_rate_( long rate )
{
	if ( !buf )
	{
		if ( !stereo_buffer )
			CHECK_ALLOC( stereo_buffer = BLARGG_NEW Stereo_Buffer );
		buf = stereo_buffer;
	}
	return buf->set_sample_rate( rate, 1000 / 20 );
}